

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::IndexMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  __hashtable *__h;
  char *local_50;
  cmMakefile *local_48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefile_*>
  local_40;
  
  local_48 = mf;
  local_50 = cmMakefile::GetCurrentSourceDirectory(mf);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefile_*>
  ::pair<const_char_*,_cmMakefile_*&,_true>(&local_40,&local_50,&local_48);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmMakefile*>,std::allocator<std::pair<std::__cxx11::string_const,cmMakefile*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,cmMakefile*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmMakefile*>,std::allocator<std::pair<std::__cxx11::string_const,cmMakefile*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->MakefileSearchIndex,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmGlobalGenerator::IndexMakefile(cmMakefile* mf)
{
  // FIXME: add_subdirectory supports multiple build directories
  // sharing the same source directory.  We currently index only the
  // first one, because that is what FindMakefile has always returned.
  // All of its callers will need to be modified to support looking
  // up directories by build directory path.
  this->MakefileSearchIndex.insert(
    MakefileMap::value_type(mf->GetCurrentSourceDirectory(), mf));
}